

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_allEqual_ivec2(ShaderEvalContext *c)

{
  ulong uVar1;
  int i;
  long lVar2;
  bool bVar3;
  Vector<int,_2> res_1;
  Vector<int,_2> res;
  float local_10 [2];
  ulong local_8;
  
  local_10[0] = c->in[0].m_data[3];
  local_10[1] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (int)local_10[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  uVar1 = *(ulong *)c->in[1].m_data;
  local_8 = uVar1 << 0x20 | uVar1 >> 0x20;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = (int)*(float *)((long)&local_8 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  bVar3 = true;
  lVar2 = 0;
  do {
    if (bVar3) {
      bVar3 = res.m_data[lVar2] == res_1.m_data[lVar2];
    }
    else {
      bVar3 = false;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  (c->color).m_data[0] = (float)bVar3;
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }